

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-as.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  PassOptions **ppPVar1;
  Options *this;
  size_type *psVar2;
  size_type *psVar3;
  size_type *psVar4;
  pointer pcVar5;
  undefined8 *puVar6;
  char cVar7;
  int iVar8;
  mapped_type *pmVar9;
  string *psVar10;
  iterator iVar11;
  long *plVar12;
  long *plVar13;
  pointer *ppuVar14;
  undefined1 local_bb0 [8];
  ToolOptions options;
  Module wasm;
  ModuleWriter writer;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  code *local_4a8;
  code *local_4a0;
  undefined1 *local_498;
  undefined8 uStack_490;
  code *local_488;
  code *pcStack_480;
  undefined1 *local_478;
  undefined8 uStack_470;
  code *local_468;
  code *pcStack_460;
  undefined1 *local_458;
  undefined8 uStack_450;
  code *local_448;
  code *pcStack_440;
  size_type **local_438;
  undefined8 uStack_430;
  code *local_428;
  code *pcStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  code *local_408;
  code *local_400;
  long *local_3f8;
  long local_3e8 [2];
  char local_3d8;
  long *local_3d0 [2];
  long local_3c0 [2];
  long *local_3b0 [2];
  long local_3a0 [2];
  long *local_390 [2];
  long local_380 [2];
  string local_370;
  string local_350;
  long *local_330 [2];
  long local_320 [2];
  long *local_310 [2];
  long local_300 [2];
  long *local_2f0 [2];
  long local_2e0 [2];
  long *local_2d0 [2];
  long local_2c0 [2];
  char **local_2b0;
  long *local_2a8 [2];
  long local_298 [2];
  long *local_288 [2];
  long local_278 [2];
  long *local_268 [2];
  long local_258 [2];
  long *local_248 [2];
  long local_238 [2];
  long *local_228 [2];
  long local_218 [2];
  long *local_208 [2];
  long local_1f8 [2];
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  long *local_1a8 [2];
  long local_198 [2];
  long *local_188 [2];
  long local_178 [2];
  long *local_168 [2];
  long local_158 [2];
  long *local_148 [2];
  long local_138 [2];
  size_type *local_128;
  string symbolMap;
  string sourceMapFilename;
  string sourceMapUrl;
  string WasmAsOption;
  undefined1 local_a0 [8];
  Result<wasm::Ok> parsed;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  __index_type local_80;
  undefined1 local_78 [32];
  undefined1 auStack_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  bool debugInfo;
  
  input.field_2._M_local_buf[0xf] = '\0';
  local_128 = &symbolMap._M_string_length;
  symbolMap._M_dataplus._M_p = (pointer)0x0;
  symbolMap._M_string_length._0_1_ = 0;
  symbolMap.field_2._8_8_ = &sourceMapFilename._M_string_length;
  sourceMapFilename._M_dataplus._M_p = (pointer)0x0;
  sourceMapFilename._M_string_length._0_1_ = 0;
  sourceMapFilename.field_2._8_8_ = &sourceMapUrl._M_string_length;
  sourceMapUrl._M_dataplus._M_p = (pointer)0x0;
  sourceMapUrl._M_string_length._0_1_ = 0;
  sourceMapUrl.field_2._8_8_ = &WasmAsOption._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&sourceMapUrl.field_2 + 8),"wasm-as options","");
  ppuVar14 = &wasm.exports.
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  options._376_8_ = ppuVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)&options.enabledFeatures,"wasm-as","");
  ppPVar1 = &writer.options;
  wasm.tagsMap._M_h._M_single_bucket = (__node_base_ptr)ppPVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&wasm.tagsMap._M_h._M_single_bucket,
             "Assemble a .wat (WebAssembly text format) into a .wasm (WebAssembly binary format)",""
            );
  ::wasm::ToolOptions::ToolOptions
            ((ToolOptions *)local_bb0,(string *)&options.enabledFeatures,
             (string *)&wasm.tagsMap._M_h._M_single_bucket);
  if (wasm.tagsMap._M_h._M_single_bucket != (__node_base_ptr)ppPVar1) {
    operator_delete(wasm.tagsMap._M_h._M_single_bucket,
                    CONCAT62(writer.options._2_6_,writer.options._0_2_) + 1);
  }
  if ((pointer *)options._376_8_ != ppuVar14) {
    operator_delete((void *)options._376_8_,
                    (ulong)((long)&((wasm.exports.
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                   .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 1));
  }
  options._376_8_ = ppuVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)&options.enabledFeatures,"validate","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&options.super_Options,(key_type *)&options.enabledFeatures);
  std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x1101e5);
  if ((pointer *)options._376_8_ != ppuVar14) {
    operator_delete((void *)options._376_8_,
                    (ulong)((long)&((wasm.exports.
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                   .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 1));
  }
  options._376_8_ = ppuVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)&options.enabledFeatures,"--output","");
  wasm.tagsMap._M_h._M_single_bucket = (__node_base_ptr)ppPVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&wasm.tagsMap._M_h._M_single_bucket,"-o","");
  local_a0 = (undefined1  [8])&local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Output file","");
  auStack_58 = (undefined1  [8])0x0;
  input._M_dataplus._M_p = (pointer)0x0;
  input.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:50:10)>
       ::_M_invoke;
  input._M_string_length =
       (size_type)
       std::
       _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:50:10)>
       ::_M_manager;
  psVar10 = (string *)
            ::wasm::Options::add
                      ((string *)&options,(string *)&options.enabledFeatures,
                       (string *)&wasm.tagsMap._M_h._M_single_bucket,(string *)local_a0,
                       (int)&sourceMapUrl + 0x18,(function *)0x1,SUB81(auStack_58,0));
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"--validate","");
  local_2a8[0] = local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"-v","");
  local_288[0] = local_278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_288,"Control validation of the output module","");
  local_4b8 = 0;
  uStack_4b0 = 0;
  local_4a0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:59:10)>
              ::_M_invoke;
  local_4a8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:59:10)>
              ::_M_manager;
  psVar10 = (string *)
            ::wasm::Options::add
                      (psVar10,(string *)local_78,(string *)local_2a8,(string *)local_288,
                       (int)&sourceMapUrl + 0x18,(function *)0x1,SUB81(&local_4b8,0));
  local_268[0] = local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"--debuginfo","");
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"-g","");
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_228,"Emit names section and debug info","");
  uStack_490 = 0;
  local_498 = (undefined1 *)((long)&input.field_2 + 0xf);
  pcStack_480 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:71:10)>
                ::_M_invoke;
  local_488 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:71:10)>
              ::_M_manager;
  psVar10 = (string *)
            ::wasm::Options::add
                      (psVar10,(string *)local_268,(string *)local_248,(string *)local_228,
                       (int)&sourceMapUrl + 0x18,(function *)0x0,SUB81(&local_498,0));
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"--source-map","");
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"-sm","");
  local_1c8[0] = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,"Emit source map to the specified file","");
  uStack_470 = 0;
  local_478 = (undefined1 *)((long)&symbolMap.field_2 + 8);
  pcStack_460 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:77:10)>
                ::_M_invoke;
  local_468 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:77:10)>
              ::_M_manager;
  psVar10 = (string *)
            ::wasm::Options::add
                      (psVar10,(string *)local_208,(string *)local_1e8,(string *)local_1c8,
                       (int)&sourceMapUrl + 0x18,(function *)0x1,SUB81(&local_478,0));
  local_1a8[0] = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"--source-map-url","");
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"-su","");
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_168,"Use specified string as source map URL","");
  uStack_450 = 0;
  local_458 = (undefined1 *)((long)&sourceMapFilename.field_2 + 8);
  pcStack_440 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:85:10)>
                ::_M_invoke;
  local_448 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:85:10)>
              ::_M_manager;
  psVar10 = (string *)
            ::wasm::Options::add
                      (psVar10,(string *)local_1a8,(string *)local_188,(string *)local_168,
                       (int)&sourceMapUrl + 0x18,(function *)0x1,SUB81(&local_458,0));
  local_148[0] = local_138;
  WasmAsOption.field_2._12_4_ = argc;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"--symbolmap","");
  local_3d0[0] = local_3c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"-s","");
  local_3b0[0] = local_3a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3b0,"Emit a symbol map (indexes => names)","");
  uStack_430 = 0;
  local_438 = &local_128;
  pcStack_420 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:93:10)>
                ::_M_invoke;
  local_428 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:93:10)>
              ::_M_manager;
  local_2b0 = argv;
  psVar10 = (string *)
            ::wasm::Options::add
                      (psVar10,(string *)local_148,(string *)local_3d0,(string *)local_3b0,
                       (int)&sourceMapUrl + 0x18,(function *)0x1,SUB81(&local_438,0));
  local_390[0] = local_380;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"INFILE","");
  local_418 = 0;
  uStack_410 = 0;
  local_400 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:96:21)>
              ::_M_invoke;
  local_408 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-as.cpp:96:21)>
              ::_M_manager;
  ::wasm::Options::add_positional(psVar10,(Arguments)local_390,(function *)0x1);
  this = &options.super_Options;
  if (local_408 != (code *)0x0) {
    (*local_408)(&local_418,&local_418,3);
  }
  if (local_390[0] != local_380) {
    operator_delete(local_390[0],local_380[0] + 1);
  }
  ppPVar1 = &writer.options;
  if (local_428 != (code *)0x0) {
    (*local_428)(&local_438,&local_438,3);
  }
  if (local_3b0[0] != local_3a0) {
    operator_delete(local_3b0[0],local_3a0[0] + 1);
  }
  if (local_3d0[0] != local_3c0) {
    operator_delete(local_3d0[0],local_3c0[0] + 1);
  }
  ppuVar14 = &wasm.exports.
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_148[0] != local_138) {
    operator_delete(local_148[0],local_138[0] + 1);
  }
  if (local_448 != (code *)0x0) {
    (*local_448)(&local_458,&local_458,3);
  }
  if (local_168[0] != local_158) {
    operator_delete(local_168[0],local_158[0] + 1);
  }
  if (local_188[0] != local_178) {
    operator_delete(local_188[0],local_178[0] + 1);
  }
  if (local_1a8[0] != local_198) {
    operator_delete(local_1a8[0],local_198[0] + 1);
  }
  if (local_468 != (code *)0x0) {
    (*local_468)(&local_478,&local_478,3);
  }
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  if (local_208[0] != local_1f8) {
    operator_delete(local_208[0],local_1f8[0] + 1);
  }
  if (local_488 != (code *)0x0) {
    (*local_488)(&local_498,&local_498,3);
  }
  if (local_228[0] != local_218) {
    operator_delete(local_228[0],local_218[0] + 1);
  }
  if (local_248[0] != local_238) {
    operator_delete(local_248[0],local_238[0] + 1);
  }
  if (local_268[0] != local_258) {
    operator_delete(local_268[0],local_258[0] + 1);
  }
  if (local_4a8 != (code *)0x0) {
    (*local_4a8)(&local_4b8,&local_4b8,3);
  }
  if (local_288[0] != local_278) {
    operator_delete(local_288[0],local_278[0] + 1);
  }
  if (local_2a8[0] != local_298) {
    operator_delete(local_2a8[0],local_298[0] + 1);
  }
  if ((pointer)local_78._0_8_ != (pointer)(local_78 + 0x10)) {
    operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
  }
  if (input._M_string_length != 0) {
    (*(code *)input._M_string_length)(auStack_58,auStack_58,3);
  }
  if (local_a0 != (undefined1  [8])&local_90) {
    operator_delete((void *)local_a0,local_90._M_allocated_capacity + 1);
  }
  if (wasm.tagsMap._M_h._M_single_bucket != (__node_base_ptr)ppPVar1) {
    operator_delete(wasm.tagsMap._M_h._M_single_bucket,
                    CONCAT62(writer.options._2_6_,writer.options._0_2_) + 1);
  }
  if ((pointer *)options._376_8_ != ppuVar14) {
    operator_delete((void *)options._376_8_,
                    (ulong)((long)&((wasm.exports.
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                   .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 1));
  }
  ::wasm::Options::parse((int)&options,(char **)(ulong)(uint)WasmAsOption.field_2._12_4_);
  options._376_8_ = ppuVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)&options.enabledFeatures,"output","");
  iVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)this,(key_type *)&options.enabledFeatures);
  if ((pointer *)options._376_8_ != ppuVar14) {
    operator_delete((void *)options._376_8_,
                    (ulong)((long)&((wasm.exports.
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                   .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 1));
  }
  if (iVar11._M_node == (_Base_ptr)&options.field_0x10) {
    local_a0 = (undefined1  [8])&local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"infile","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)this,(key_type *)local_a0);
    pcVar5 = (pmVar9->_M_dataplus)._M_p;
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_370,pcVar5,pcVar5 + pmVar9->_M_string_length);
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,".wat","");
    ::wasm::removeSpecificSuffix
              ((string *)&wasm.tagsMap._M_h._M_single_bucket,&local_370,&local_350);
    plVar12 = (long *)std::__cxx11::string::append((char *)&wasm.tagsMap._M_h._M_single_bucket);
    plVar13 = plVar12 + 2;
    if ((long *)*plVar12 == plVar13) {
      wasm.exports.
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar13;
      wasm.exports.
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)plVar12[3];
      wasm.exports.
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           *(undefined4 *)((long)plVar12 + 0x1c);
      options._376_8_ = ppuVar14;
    }
    else {
      wasm.exports.
      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar13;
      options._376_8_ = (long *)*plVar12;
    }
    wasm.exports.
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar12[1];
    *plVar12 = (long)plVar13;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    auStack_58 = (undefined1  [8])&input._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"output","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)this,(key_type *)auStack_58);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&options.enabledFeatures);
    if (auStack_58 != (undefined1  [8])&input._M_string_length) {
      operator_delete((void *)auStack_58,input._M_string_length + 1);
    }
    if ((pointer *)options._376_8_ !=
        &wasm.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
      operator_delete((void *)options._376_8_,
                      (ulong)((long)&((wasm.exports.
                                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                                     super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                     .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 1)
                     );
    }
    if (wasm.tagsMap._M_h._M_single_bucket != (__node_base_ptr)ppPVar1) {
      operator_delete(wasm.tagsMap._M_h._M_single_bucket,
                      CONCAT62(writer.options._2_6_,writer.options._0_2_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    if (local_a0 != (undefined1  [8])&local_90) {
      operator_delete((void *)local_a0,local_90._M_allocated_capacity + 1);
    }
  }
  ppuVar14 = &wasm.exports.
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  options._376_8_ = ppuVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)&options.enabledFeatures,"infile","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)this,(key_type *)&options.enabledFeatures);
  ::wasm::read_file<std::__cxx11::string>((string *)auStack_58,(BinaryOption)pmVar9);
  if ((pointer *)options._376_8_ != ppuVar14) {
    operator_delete((void *)options._376_8_,
                    (ulong)((long)&((wasm.exports.
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                   .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 1));
  }
  ::wasm::Module::Module((Module *)&options.enabledFeatures);
  wasm.debugInfoSourcesContent.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
       ~options.profile &
       ((uint)wasm.debugInfoSourcesContent.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage | options._368_4_);
  local_3d8 = '\0';
  ::wasm::WATParser::parseModule
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
             &options.enabledFeatures,input._M_dataplus._M_p,auStack_58);
  if ((local_3d8 == '\x01') && (local_3d8 = '\0', local_3f8 != local_3e8)) {
    operator_delete(local_3f8,local_3e8[0] + 1);
  }
  if (local_80 != '\x01') {
    if (options.passOptions.passesToSkip._M_h._M_single_bucket._1_1_ == '\0') {
      while ((undefined8 *)wasm.typeIndices._M_h._M_bucket_count != (undefined8 *)0x0) {
        puVar6 = *(undefined8 **)wasm.typeIndices._M_h._M_bucket_count;
        operator_delete((void *)wasm.typeIndices._M_h._M_bucket_count,0x20);
        wasm.typeIndices._M_h._M_bucket_count = (size_type)puVar6;
      }
      memset(wasm.typeNames._M_h._M_single_bucket,0,(long)wasm.typeIndices._M_h._M_buckets << 3);
      wasm.typeIndices._M_h._M_bucket_count = 0;
      wasm.typeIndices._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    }
    wasm.tagsMap._M_h._M_single_bucket = (__node_base_ptr)ppPVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&wasm.tagsMap._M_h._M_single_bucket,"validate","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)this,(key_type *)&wasm.tagsMap._M_h._M_single_bucket);
    iVar8 = std::__cxx11::string::compare((char *)pmVar9);
    if (wasm.tagsMap._M_h._M_single_bucket != (__node_base_ptr)ppPVar1) {
      operator_delete(wasm.tagsMap._M_h._M_single_bucket,
                      CONCAT62(writer.options._2_6_,writer.options._0_2_) + 1);
    }
    if (iVar8 != 0) {
      if ((char)options._vptr_ToolOptions == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Validating...",0xd);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
        std::ostream::put(-0x38);
        std::ostream::flush();
      }
      wasm.tagsMap._M_h._M_single_bucket = (__node_base_ptr)ppPVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&wasm.tagsMap._M_h._M_single_bucket,"validate","");
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)this,(key_type *)&wasm.tagsMap._M_h._M_single_bucket);
      std::__cxx11::string::compare((char *)pmVar9);
      cVar7 = ::wasm::WasmValidator::validate((Module *)local_78,(int)&options + 0x178);
      if (wasm.tagsMap._M_h._M_single_bucket != (__node_base_ptr)ppPVar1) {
        operator_delete(wasm.tagsMap._M_h._M_single_bucket,
                        CONCAT62(writer.options._2_6_,writer.options._0_2_) + 1);
      }
      if (cVar7 == '\0') {
        ::wasm::Fatal::Fatal((Fatal *)&wasm.tagsMap._M_h._M_single_bucket);
        ::wasm::Fatal::operator<<
                  ((Fatal *)&wasm.tagsMap._M_h._M_single_bucket,
                   (char (*) [35])"Error: input module is not valid.\n");
        goto LAB_0010876d;
      }
    }
    if ((char)options._vptr_ToolOptions == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"writing...",10);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
      std::ostream::put(-0x38);
      std::ostream::flush();
    }
    writer._0_8_ = &options.field_0xb0;
    psVar2 = &writer.symbolMap._M_string_length;
    writer.options._0_2_ = 1;
    writer.symbolMap._M_dataplus._M_p = (pointer)0x0;
    writer.symbolMap._M_string_length._0_1_ = 0;
    psVar3 = &writer.sourceMapFilename._M_string_length;
    writer.sourceMapFilename._M_dataplus._M_p = (pointer)0x0;
    writer.sourceMapFilename._M_string_length._0_1_ = 0;
    psVar4 = &writer.sourceMapUrl._M_string_length;
    writer.sourceMapUrl._M_dataplus._M_p = (pointer)0x0;
    writer.sourceMapUrl._M_string_length._0_1_ = 0;
    wasm.tagsMap._M_h._M_single_bucket =
         (__node_base_ptr)
         CONCAT71(wasm.tagsMap._M_h._M_single_bucket._1_7_,input.field_2._M_local_buf[0xf]);
    writer._16_8_ = psVar2;
    writer.symbolMap.field_2._8_8_ = psVar3;
    writer.sourceMapFilename.field_2._8_8_ = psVar4;
    if (sourceMapFilename._M_dataplus._M_p != (pointer)0x0) {
      local_330[0] = local_320;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_330,symbolMap.field_2._8_8_,
                 sourceMapFilename._M_dataplus._M_p + symbolMap.field_2._8_8_);
      std::__cxx11::string::_M_assign((string *)(writer.symbolMap.field_2._M_local_buf + 8));
      if (local_330[0] != local_320) {
        operator_delete(local_330[0],local_320[0] + 1);
      }
      local_310[0] = local_300;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_310,sourceMapFilename.field_2._8_8_,
                 sourceMapUrl._M_dataplus._M_p + sourceMapFilename.field_2._8_8_);
      std::__cxx11::string::_M_assign((string *)(writer.sourceMapFilename.field_2._M_local_buf + 8))
      ;
      if (local_310[0] != local_300) {
        operator_delete(local_310[0],local_300[0] + 1);
      }
    }
    if (symbolMap._M_dataplus._M_p != (pointer)0x0) {
      local_2f0[0] = local_2e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2f0,local_128,symbolMap._M_dataplus._M_p + (long)local_128);
      std::__cxx11::string::_M_assign((string *)&writer.binary);
      if (local_2f0[0] != local_2e0) {
        operator_delete(local_2f0[0],local_2e0[0] + 1);
      }
    }
    local_78._0_8_ = local_78 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"output","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)this,(key_type *)local_78);
    pcVar5 = (pmVar9->_M_dataplus)._M_p;
    local_2d0[0] = local_2c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2d0,pcVar5,pcVar5 + pmVar9->_M_string_length);
    ::wasm::ModuleWriter::write
              (&wasm.tagsMap._M_h._M_single_bucket,&options.enabledFeatures,local_2d0);
    if (local_2d0[0] != local_2c0) {
      operator_delete(local_2d0[0],local_2c0[0] + 1);
    }
    if ((pointer)local_78._0_8_ != (pointer)(local_78 + 0x10)) {
      operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
    }
    if ((char)options._vptr_ToolOptions == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Done.",5);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
      std::ostream::put(-0x38);
      std::ostream::flush();
    }
    if ((size_type *)writer.sourceMapFilename.field_2._8_8_ != psVar4) {
      operator_delete((void *)writer.sourceMapFilename.field_2._8_8_,
                      CONCAT71(writer.sourceMapUrl._M_string_length._1_7_,
                               (undefined1)writer.sourceMapUrl._M_string_length) + 1);
    }
    if ((size_type *)writer.symbolMap.field_2._8_8_ != psVar3) {
      operator_delete((void *)writer.symbolMap.field_2._8_8_,
                      CONCAT71(writer.sourceMapFilename._M_string_length._1_7_,
                               (undefined1)writer.sourceMapFilename._M_string_length) + 1);
    }
    if ((size_type *)writer._16_8_ != psVar2) {
      operator_delete((void *)writer._16_8_,
                      CONCAT71(writer.symbolMap._M_string_length._1_7_,
                               (undefined1)writer.symbolMap._M_string_length) + 1);
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_a0);
    ::wasm::Module::~Module((Module *)&options.enabledFeatures);
    if (auStack_58 != (undefined1  [8])&input._M_string_length) {
      operator_delete((void *)auStack_58,input._M_string_length + 1);
    }
    ::wasm::ToolOptions::~ToolOptions((ToolOptions *)local_bb0);
    if ((size_type *)sourceMapUrl.field_2._8_8_ != &WasmAsOption._M_string_length) {
      operator_delete((void *)sourceMapUrl.field_2._8_8_,WasmAsOption._M_string_length + 1);
    }
    if ((size_type *)sourceMapFilename.field_2._8_8_ != &sourceMapUrl._M_string_length) {
      operator_delete((void *)sourceMapFilename.field_2._8_8_,
                      CONCAT71(sourceMapUrl._M_string_length._1_7_,
                               (undefined1)sourceMapUrl._M_string_length) + 1);
    }
    if ((size_type *)symbolMap.field_2._8_8_ != &sourceMapFilename._M_string_length) {
      operator_delete((void *)symbolMap.field_2._8_8_,
                      CONCAT71(sourceMapFilename._M_string_length._1_7_,
                               (undefined1)sourceMapFilename._M_string_length) + 1);
    }
    if (local_128 != &symbolMap._M_string_length) {
      operator_delete(local_128,
                      CONCAT71(symbolMap._M_string_length._1_7_,
                               (undefined1)symbolMap._M_string_length) + 1);
    }
    return 0;
  }
  ::wasm::Fatal::Fatal((Fatal *)&wasm.tagsMap._M_h._M_single_bucket);
  ::wasm::Fatal::operator<<
            ((Fatal *)&wasm.tagsMap._M_h._M_single_bucket,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
LAB_0010876d:
  ::wasm::Fatal::~Fatal((Fatal *)&wasm.tagsMap._M_h._M_single_bucket);
}

Assistant:

int main(int argc, const char* argv[]) {
  bool debugInfo = false;
  std::string symbolMap;
  std::string sourceMapFilename;
  std::string sourceMapUrl;

  const std::string WasmAsOption = "wasm-as options";

  ToolOptions options("wasm-as",
                      "Assemble a .wat (WebAssembly text format) into a .wasm "
                      "(WebAssembly binary format)");
  options.extra["validate"] = "wasm";
  options
    .add("--output",
         "-o",
         "Output file",
         WasmAsOption,
         Options::Arguments::One,
         [](Options* o, const std::string& argument) {
           o->extra["output"] = argument;
           Colors::setEnabled(false);
         })
    .add("--validate",
         "-v",
         "Control validation of the output module",
         WasmAsOption,
         Options::Arguments::One,
         [](Options* o, const std::string& argument) {
           if (argument != "web" && argument != "none" && argument != "wasm") {
             Fatal() << "Valid arguments for --validate flag are 'wasm', "
                        "'web', and 'none'.\n";
           }
           o->extra["validate"] = argument;
         })
    .add("--debuginfo",
         "-g",
         "Emit names section and debug info",
         WasmAsOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arguments) { debugInfo = true; })
    .add("--source-map",
         "-sm",
         "Emit source map to the specified file",
         WasmAsOption,
         Options::Arguments::One,
         [&sourceMapFilename](Options* o, const std::string& argument) {
           sourceMapFilename = argument;
         })
    .add("--source-map-url",
         "-su",
         "Use specified string as source map URL",
         WasmAsOption,
         Options::Arguments::One,
         [&sourceMapUrl](Options* o, const std::string& argument) {
           sourceMapUrl = argument;
         })
    .add("--symbolmap",
         "-s",
         "Emit a symbol map (indexes => names)",
         WasmAsOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { symbolMap = argument; })
    .add_positional("INFILE",
                    Options::Arguments::One,
                    [](Options* o, const std::string& argument) {
                      o->extra["infile"] = argument;
                    });
  options.parse(argc, argv);

  // default output is infile with changed suffix
  if (options.extra.find("output") == options.extra.end()) {
    options.extra["output"] =
      removeSpecificSuffix(options.extra["infile"], ".wat") + ".wasm";
  }

  auto input(read_file<std::string>(options.extra["infile"], Flags::Text));

  Module wasm;
  options.applyOptionsBeforeParse(wasm);

  auto parsed = WATParser::parseModule(wasm, input);
  if (auto* err = parsed.getErr()) {
    Fatal() << err->msg;
  }

  options.applyOptionsAfterParse(wasm);

  if (options.extra["validate"] != "none") {
    if (options.debug) {
      std::cerr << "Validating..." << std::endl;
    }
    if (!wasm::WasmValidator().validate(
          wasm,
          WasmValidator::Globally |
            (options.extra["validate"] == "web" ? WasmValidator::Web : 0))) {
      Fatal() << "Error: input module is not valid.\n";
    }
  }

  if (options.debug) {
    std::cerr << "writing..." << std::endl;
  }
  ModuleWriter writer(options.passOptions);
  writer.setBinary(true);
  writer.setDebugInfo(debugInfo);
  if (sourceMapFilename.size()) {
    writer.setSourceMapFilename(sourceMapFilename);
    writer.setSourceMapUrl(sourceMapUrl);
  }
  if (symbolMap.size() > 0) {
    writer.setSymbolMap(symbolMap);
  }
  writer.write(wasm, options.extra["output"]);

  if (options.debug) {
    std::cerr << "Done." << std::endl;
  }
}